

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O0

void testing_error_(testing t,int test_status,char *file,int line,char *msg)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  char *local_60;
  char *local_50;
  int addnl;
  int len;
  char *msg_local;
  int line_local;
  char *file_local;
  int test_status_local;
  testing t_local;
  
  sVar2 = strlen(msg);
  bVar4 = true;
  if ((int)sVar2 != 0) {
    bVar4 = msg[(int)sVar2 + -1] != '\n';
  }
  if (t->test_status < test_status) {
    t->test_status = test_status;
  }
  uVar1 = std::atomic_load_explicit<unsigned_int>(&t->partial_line,memory_order_relaxed);
  if (uVar1 == 0) {
    if (test_status == 2) {
      local_60 = "fatal";
    }
    else {
      local_60 = "info";
      if (test_status == 1) {
        local_60 = "error";
      }
    }
    pcVar3 = "";
    if (bVar4) {
      pcVar3 = "\n";
    }
    fprintf((FILE *)t->fp,"%s: %s:%d: %s%s",local_60,file,(ulong)(uint)line,msg,pcVar3);
  }
  else {
    std::atomic_store_explicit<unsigned_int>(&t->partial_line,0,memory_order_relaxed);
    if (test_status == 2) {
      local_50 = "fatal";
    }
    else {
      local_50 = "info";
      if (test_status == 1) {
        local_50 = "error";
      }
    }
    pcVar3 = "";
    if (bVar4) {
      pcVar3 = "\n";
    }
    fprintf((FILE *)t->fp,"\n%s: %s:%d: %s%s",local_50,file,(ulong)(uint)line,msg,pcVar3);
  }
  free(msg);
  return;
}

Assistant:

void testing_error_ (testing t, int test_status, const char *file, int line, char *msg) {
	int len = strlen (msg);
	int addnl = (len == 0 || msg[len - 1] != '\n');
	if (t->test_status < test_status) {
		t->test_status = test_status;
	}
	if (ATM_LOAD (&t->partial_line)) {
		ATM_STORE (&t->partial_line, 0);
		fprintf (t->fp, "\n%s: %s:%d: %s%s",
		         test_status == 2? "fatal": test_status == 1? "error": "info", file, line, msg,
		         addnl? "\n": "");
	} else {
		fprintf (t->fp, "%s: %s:%d: %s%s",
		         test_status == 2? "fatal": test_status == 1? "error": "info", file, line, msg,
		         addnl? "\n": "");
	}
	free (msg);
}